

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_short_Test::TestBody
          (ByteBufferTest_test_read_write_short_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  short local_ca;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  short local_82;
  int16_t short2;
  Message local_78;
  short local_6a;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_48 [8];
  ByteBuffer byte_buffer1;
  short local_12;
  ByteBufferTest_test_read_write_short_Test *pBStack_10;
  int16_t short1;
  ByteBufferTest_test_read_write_short_Test *this_local;
  
  local_12 = 0x236;
  pBStack_10 = this;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_48,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)local_48);
  local_6a = bidfx_public_api::tools::ByteBuffer::ReadShort();
  testing::internal::EqHelper<false>::Compare<short,short>
            ((EqHelper<false> *)local_68,"short1","byte_buffer1.ReadShort()",&local_12,&local_6a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff80,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_82 = -0x1b1;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)&gtest_ar_1 + 8);
  local_ca = bidfx_public_api::tools::ByteBuffer::ReadShort();
  testing::internal::EqHelper<false>::Compare<short,short>
            ((EqHelper<false> *)local_c8,"short2","byte_buffer2.ReadShort()",&local_82,&local_ca);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_48);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_short)
{
    int16_t short1 = 566;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteShort(short1);
    EXPECT_EQ(short1, byte_buffer1.ReadShort());

    int16_t short2 = -433;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteShort(short2);
    EXPECT_EQ(short2, byte_buffer2.ReadShort());
}